

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O3

void __thiscall Color::blend(Color *this,Color *other)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  unsigned_long uVar5;
  Color CVar6;
  Color c;
  Color local_18;
  
  CVar6 = (Color)other->_value;
  if (CVar6._value == 0) {
    return;
  }
  uVar2 = this->_value;
  uVar4 = (uint)CVar6._value;
  uVar3 = (uint)uVar2;
  if (uVar4 == uVar3) {
    return;
  }
  uVar1 = uVar4 & 0x46000000 | uVar2;
  this->_value = uVar1;
  local_18._value = CVar6._value;
  if ((int)(uVar3 | uVar4) < 0) {
    if (-1 < (int)uVar3) {
      upgrade24b(this);
    }
    if (-1 < (int)uVar4) {
      upgrade24b(&local_18);
      CVar6._value = local_18._value;
    }
    uVar3 = (uint)CVar6._value;
    if ((uVar3 >> 0x1b & 1) != 0) {
      this->_value = (ulong)(uVar3 & 0x8ffffff) | this->_value & 0xfffffffff7000000;
    }
    if ((uVar3 >> 0x1c & 1) == 0) {
      return;
    }
    uVar2 = this->_value & 0xff000000efffffff;
    uVar1 = CVar6._value & 0xffffff10000000;
  }
  else {
    if (((uVar3 | uVar4) >> 0x1d & 1) == 0) {
      uVar2 = (CVar6._value & 0xff) + 0x8000000 +
              ((ulong)(uVar4 & 0x46000000) | uVar2 & 0xffffffff57ffff00 | (ulong)(uVar4 & 0x1000000)
              );
      if ((uVar4 >> 0x1b & 1) == 0) {
        uVar2 = uVar1 | uVar4 & 0x1000000;
      }
      this->_value = uVar2;
      if ((uVar4 >> 0x1c & 1) == 0) {
        return;
      }
      uVar5 = (ulong)(uVar4 & 0x1000ff00) | uVar2 & 0xffffffffefff00ff;
      goto LAB_0015c943;
    }
    if ((uVar3 >> 0x1d & 1) == 0) {
      upgrade(this);
    }
    if ((uVar4 >> 0x1d & 1) == 0) {
      upgrade(&local_18);
      CVar6._value = local_18._value;
    }
    uVar3 = (uint)CVar6._value;
    if ((uVar3 >> 0x1b & 1) != 0) {
      this->_value = (ulong)(uVar3 & 0x80000ff) | this->_value & 0xfffffffff7ffff00;
    }
    if ((uVar3 >> 0x1c & 1) == 0) {
      return;
    }
    uVar2 = this->_value & 0xffffffffefff00ff;
    uVar1 = (ulong)(uVar3 & 0x1000ff00);
  }
  uVar5 = uVar1 | uVar2;
LAB_0015c943:
  this->_value = uVar5;
  return;
}

Assistant:

bool Color::nontrivial () const
{
  return _value != 0;
}